

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QThreadPrivate::~QThreadPrivate(QThreadPrivate *this)

{
  QThreadData *this_00;
  BindingStatusOrList *in_RDI;
  QThreadData *unaff_retaddr;
  QObjectPrivate *in_stack_00000030;
  
  (in_RDI->data).super___atomic_base<unsigned_long_long>._M_i =
       (__int_type)&PTR__QThreadPrivate_00be8620;
  this_00 = (QThreadData *)QtPrivate::BindingStatusOrList::list(in_RDI);
  if (this_00 != (QThreadData *)0x0) {
    std::vector<QObject_*,_std::allocator<QObject_*>_>::~vector
              ((vector<QObject_*,_std::allocator<QObject_*>_> *)unaff_retaddr);
    operator_delete(this_00,0x18);
  }
  QThreadData::clearEvents(unaff_retaddr);
  QThreadData::deref(this_00);
  QString::~QString((QString *)0x556888);
  QWaitCondition::~QWaitCondition((QWaitCondition *)this_00);
  QMutex::~QMutex((QMutex *)this_00);
  QObjectPrivate::~QObjectPrivate(in_stack_00000030);
  return;
}

Assistant:

QThreadPrivate::~QThreadPrivate()
{
    // access to m_statusOrPendingObjects cannot race with anything
    // unless there is already a potential use-after-free bug, as the
    // thread is in the process of being destroyed
    delete m_statusOrPendingObjects.list();
    data->clearEvents();
    data->deref();
}